

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cpp
# Opt level: O2

void error(String *msg)

{
  bool bVar1;
  Lexer *this;
  runtime_error *this_00;
  TokenInfo *pTVar2;
  String local_78;
  String local_58;
  String fileinfo;
  
  this = Lexer::GetCurrentLexer();
  fileinfo._string._M_dataplus._M_p = (pointer)&fileinfo._string.field_2;
  fileinfo._string._M_string_length = 0;
  fileinfo._string.field_2._M_local_buf[0] = '\0';
  if (this != (Lexer *)0x0) {
    bVar1 = Lexer::hasValidToken(this);
    if (bVar1) {
      pTVar2 = Lexer::token(this);
      String::String(&local_58,"%1:%2:%3: ");
      format<String,int,int>(&local_78,&local_58,&pTVar2->file,&pTVar2->line,&pTVar2->column);
      std::__cxx11::string::operator=((string *)&fileinfo,(string *)&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_58);
    }
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  String::operator+(&local_78,&fileinfo,msg);
  std::runtime_error::runtime_error(this_00,local_78._string._M_dataplus._M_p);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void error (const String& msg)
{
	Lexer* lx = Lexer::GetCurrentLexer();
	String fileinfo;

	if (lx != null and lx->hasValidToken())
	{
		Lexer::TokenInfo* tk = lx->token();
		fileinfo = format ("%1:%2:%3: ", tk->file, tk->line, tk->column);
	}

    throw std::runtime_error ((fileinfo + msg).c_str());
}